

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_vadd(SAM_hdr *sh,char *type,__va_list_tag *ap,...)

{
  char cVar1;
  char cVar2;
  SAM_hdr_item_s *pSVar3;
  char *pcVar4;
  char in_AL;
  khint_t kVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  SAM_hdr_type *pSVar10;
  char *pcVar11;
  SAM_hdr_tag_s *pSVar12;
  ulong uVar13;
  SAM_hdr_tag *pSVar14;
  SAM_hdr_tag *pSVar15;
  undefined8 in_RCX;
  size_t sVar16;
  undefined8 *puVar17;
  size_t sVar18;
  size_t sVar19;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar20;
  size_t sVar21;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  int new;
  undefined8 *local_120;
  int local_104;
  SAM_hdr_type *local_100;
  SAM_hdr_tag *local_f8;
  char *local_f0;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar1 = *type;
  cVar2 = type[1];
  uVar8 = (sh->text).l;
  uVar13 = uVar8 + 1;
  local_f0 = type;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((sh->text).m < uVar13) {
    uVar8 = uVar8 >> 1 | uVar8;
    uVar8 = uVar8 >> 2 | uVar8;
    uVar8 = uVar8 >> 4 | uVar8;
    uVar8 = uVar8 >> 8 | uVar8;
    sVar18 = (uVar8 >> 0x10 | uVar8) + 1;
    (sh->text).m = sVar18;
    pcVar9 = (char *)realloc((sh->text).s,sVar18);
    if (pcVar9 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar9;
    uVar8 = (sh->text).l;
    uVar13 = uVar8 + 1;
  }
  else {
    pcVar9 = (sh->text).s;
  }
  (sh->text).l = uVar13;
  pcVar9[uVar8] = '@';
  sVar16 = (sh->text).l;
  uVar13 = sVar16 + 3;
  if (uVar13 < (sh->text).m) {
    pcVar9 = (sh->text).s;
  }
  else {
    uVar13 = uVar13 >> 1 | uVar13;
    uVar13 = uVar13 >> 2 | uVar13;
    uVar13 = uVar13 >> 4 | uVar13;
    uVar13 = uVar13 >> 8 | uVar13;
    sVar18 = (uVar13 >> 0x10 | uVar13) + 1;
    (sh->text).m = sVar18;
    pcVar9 = (char *)realloc((sh->text).s,sVar18);
    if (pcVar9 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar9;
    sVar16 = (sh->text).l;
  }
  *(undefined2 *)(pcVar9 + sVar16) = *(undefined2 *)local_f0;
  sVar16 = (sh->text).l;
  (sh->text).l = sVar16 + 2;
  (sh->text).s[sVar16 + 2] = '\0';
  local_100 = (SAM_hdr_type *)pool_alloc(sh->type_pool);
  if (local_100 == (SAM_hdr_type *)0x0) {
    return -1;
  }
  kVar5 = kh_put_sam_hdr(sh->h,(int)cVar1 << 8 | (int)cVar2,&local_104);
  if (kVar5 == 0xffffffff) {
    return -1;
  }
  sh->h->vals[kVar5] = local_100;
  if (local_104 == 0) {
    pSVar10 = sh->h->vals[kVar5];
    pSVar3 = pSVar10->prev;
    pSVar3->next = local_100;
    local_100->prev = pSVar3;
    pSVar10->prev = local_100;
    iVar7 = pSVar3->order + 1;
  }
  else {
    local_100->prev = local_100;
    iVar7 = 0;
    pSVar10 = local_100;
  }
  local_100->next = pSVar10;
  local_100->order = iVar7;
  local_120 = (undefined8 *)&stack0x00000008;
  uVar6 = 0x18;
  local_f8 = (SAM_hdr_tag *)&local_100->tag;
  pSVar15 = (SAM_hdr_tag *)0x0;
  while( true ) {
    uVar13 = (ulong)uVar6;
    if (uVar13 < 0x29) {
      puVar17 = (undefined8 *)((long)local_e8 + uVar13);
      uVar6 = uVar6 + 8;
      uVar13 = (ulong)uVar6;
    }
    else {
      puVar17 = local_120;
      local_120 = local_120 + 1;
    }
    pcVar9 = (char *)*puVar17;
    if (pcVar9 == (char *)0x0) {
      while( true ) {
        uVar6 = ap->gp_offset;
        if ((ulong)uVar6 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar6 + (long)ap->reg_save_area);
          uVar6 = uVar6 + 8;
          ap->gp_offset = uVar6;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        pcVar9 = (char *)*puVar17;
        if (pcVar9 == (char *)0x0) {
          sVar16 = (sh->text).l;
          uVar13 = sVar16 + 1;
          if (uVar13 < (sh->text).m) {
            pcVar9 = (sh->text).s;
          }
          else {
            uVar13 = uVar13 >> 1 | uVar13;
            uVar13 = uVar13 >> 2 | uVar13;
            uVar13 = uVar13 >> 4 | uVar13;
            uVar13 = uVar13 >> 8 | uVar13;
            sVar18 = (uVar13 >> 0x10 | uVar13) + 1;
            (sh->text).m = sVar18;
            pcVar9 = (char *)realloc((sh->text).s,sVar18);
            if (pcVar9 == (char *)0x0) {
              return -1;
            }
            (sh->text).s = pcVar9;
            sVar16 = (sh->text).l;
            uVar13 = sVar16 + 1;
          }
          pSVar10 = local_100;
          (sh->text).l = uVar13;
          pcVar9[sVar16] = '\n';
          (sh->text).s[(sh->text).l] = '\0';
          iVar7 = sam_hdr_update_hashes(sh,(int)local_f0[1] | (int)*local_f0 << 8,local_100);
          if (iVar7 != -1) {
            return pSVar10->order;
          }
          return -1;
        }
        if (uVar6 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar6 + (long)ap->reg_save_area);
          ap->gp_offset = uVar6 + 8;
        }
        else {
          puVar17 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar17 + 1;
        }
        pcVar4 = (char *)*puVar17;
        uVar8 = (sh->text).l;
        uVar13 = uVar8 + 1;
        if ((sh->text).m < uVar13) {
          uVar8 = uVar8 >> 1 | uVar8;
          uVar8 = uVar8 >> 2 | uVar8;
          uVar8 = uVar8 >> 4 | uVar8;
          uVar8 = uVar8 >> 8 | uVar8;
          sVar18 = (uVar8 >> 0x10 | uVar8) + 1;
          (sh->text).m = sVar18;
          pcVar11 = (char *)realloc((sh->text).s,sVar18);
          if (pcVar11 == (char *)0x0) {
            return -1;
          }
          (sh->text).s = pcVar11;
          uVar8 = (sh->text).l;
          uVar13 = uVar8 + 1;
        }
        else {
          pcVar11 = (sh->text).s;
        }
        (sh->text).l = uVar13;
        pcVar11[uVar8] = '\t';
        pSVar14 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
        if (pSVar14 == (SAM_hdr_tag *)0x0) {
          return -1;
        }
        sVar16 = (sh->text).l;
        sVar18 = strlen(pcVar9);
        sVar20 = (size_t)(int)sVar18;
        uVar13 = sVar20 + sVar16 + 1;
        if (uVar13 < (sh->text).m) {
          pcVar11 = (sh->text).s;
          sVar21 = sVar16;
        }
        else {
          uVar13 = uVar13 >> 1 | uVar13;
          uVar13 = uVar13 >> 2 | uVar13;
          uVar13 = uVar13 >> 4 | uVar13;
          uVar13 = uVar13 >> 8 | uVar13;
          sVar19 = (uVar13 >> 0x10 | uVar13) + 1;
          (sh->text).m = sVar19;
          pcVar11 = (char *)realloc((sh->text).s,sVar19);
          if (pcVar11 == (char *)0x0) {
            return -1;
          }
          (sh->text).s = pcVar11;
          sVar21 = (sh->text).l;
        }
        memcpy(pcVar11 + sVar21,pcVar9,sVar20);
        sVar21 = sVar20 + (sh->text).l;
        (sh->text).l = sVar21;
        (sh->text).s[sVar21] = '\0';
        if ((int)sVar18 == -1) {
          return -1;
        }
        uVar8 = (sh->text).l;
        uVar13 = uVar8 + 1;
        if ((sh->text).m < uVar13) {
          uVar8 = uVar8 >> 1 | uVar8;
          uVar8 = uVar8 >> 2 | uVar8;
          uVar8 = uVar8 >> 4 | uVar8;
          uVar8 = uVar8 >> 8 | uVar8;
          sVar18 = (uVar8 >> 0x10 | uVar8) + 1;
          (sh->text).m = sVar18;
          pcVar9 = (char *)realloc((sh->text).s,sVar18);
          if (pcVar9 == (char *)0x0) {
            return -1;
          }
          (sh->text).s = pcVar9;
          uVar8 = (sh->text).l;
          uVar13 = uVar8 + 1;
        }
        else {
          pcVar9 = (sh->text).s;
        }
        (sh->text).l = uVar13;
        pcVar9[uVar8] = ':';
        sVar18 = strlen(pcVar4);
        sVar21 = (sh->text).l;
        sVar20 = (size_t)(int)sVar18;
        uVar13 = sVar21 + sVar20 + 1;
        if (uVar13 < (sh->text).m) {
          pcVar9 = (sh->text).s;
        }
        else {
          uVar13 = uVar13 >> 1 | uVar13;
          uVar13 = uVar13 >> 2 | uVar13;
          uVar13 = uVar13 >> 4 | uVar13;
          uVar13 = uVar13 >> 8 | uVar13;
          sVar19 = (uVar13 >> 0x10 | uVar13) + 1;
          (sh->text).m = sVar19;
          pcVar9 = (char *)realloc((sh->text).s,sVar19);
          if (pcVar9 == (char *)0x0) {
            return -1;
          }
          (sh->text).s = pcVar9;
          sVar21 = (sh->text).l;
        }
        memcpy(pcVar9 + sVar21,pcVar4,sVar20);
        sVar21 = sVar20 + (sh->text).l;
        (sh->text).l = sVar21;
        (sh->text).s[sVar21] = '\0';
        if ((int)sVar18 == -1) break;
        iVar7 = (int)(sh->text).l - (int)sVar16;
        pSVar14->len = iVar7;
        pcVar9 = string_ndup(sh->str_pool,(sh->text).s + (int)sVar16,(long)iVar7);
        pSVar14->str = pcVar9;
        pSVar14->next = (SAM_hdr_tag_s *)0x0;
        if (pcVar9 == (char *)0x0) {
          return -1;
        }
        if (pSVar15 == (SAM_hdr_tag *)0x0) {
          pSVar15 = local_f8;
        }
        pSVar15->next = pSVar14;
        pSVar15 = pSVar14;
      }
      return -1;
    }
    if ((uint)uVar13 < 0x29) {
      uVar6 = (uint)uVar13 + 8;
      puVar17 = (undefined8 *)((long)local_e8 + uVar13);
    }
    else {
      puVar17 = local_120;
      local_120 = local_120 + 1;
    }
    pcVar4 = (char *)*puVar17;
    uVar8 = (sh->text).l;
    uVar13 = uVar8 + 1;
    if ((sh->text).m < uVar13) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      sVar18 = (uVar8 >> 0x10 | uVar8) + 1;
      (sh->text).m = sVar18;
      pcVar11 = (char *)realloc((sh->text).s,sVar18);
      if (pcVar11 == (char *)0x0) {
        return -1;
      }
      (sh->text).s = pcVar11;
      uVar8 = (sh->text).l;
      uVar13 = uVar8 + 1;
    }
    else {
      pcVar11 = (sh->text).s;
    }
    (sh->text).l = uVar13;
    pcVar11[uVar8] = '\t';
    pSVar12 = (SAM_hdr_tag_s *)pool_alloc(sh->tag_pool);
    if (pSVar12 == (SAM_hdr_tag_s *)0x0) {
      return -1;
    }
    sVar16 = (sh->text).l;
    sVar18 = strlen(pcVar9);
    sVar20 = (size_t)(int)sVar18;
    uVar13 = sVar20 + sVar16 + 1;
    if (uVar13 < (sh->text).m) {
      pcVar11 = (sh->text).s;
      sVar21 = sVar16;
    }
    else {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      sVar19 = (uVar13 >> 0x10 | uVar13) + 1;
      (sh->text).m = sVar19;
      pcVar11 = (char *)realloc((sh->text).s,sVar19);
      if (pcVar11 == (char *)0x0) {
        return -1;
      }
      (sh->text).s = pcVar11;
      sVar21 = (sh->text).l;
    }
    memcpy(pcVar11 + sVar21,pcVar9,sVar20);
    sVar21 = sVar20 + (sh->text).l;
    (sh->text).l = sVar21;
    (sh->text).s[sVar21] = '\0';
    if ((int)sVar18 == -1) break;
    uVar8 = (sh->text).l;
    uVar13 = uVar8 + 1;
    if ((sh->text).m < uVar13) {
      uVar8 = uVar8 >> 1 | uVar8;
      uVar8 = uVar8 >> 2 | uVar8;
      uVar8 = uVar8 >> 4 | uVar8;
      uVar8 = uVar8 >> 8 | uVar8;
      sVar18 = (uVar8 >> 0x10 | uVar8) + 1;
      (sh->text).m = sVar18;
      pcVar9 = (char *)realloc((sh->text).s,sVar18);
      if (pcVar9 == (char *)0x0) {
        return -1;
      }
      (sh->text).s = pcVar9;
      uVar8 = (sh->text).l;
      uVar13 = uVar8 + 1;
    }
    else {
      pcVar9 = (sh->text).s;
    }
    (sh->text).l = uVar13;
    pcVar9[uVar8] = ':';
    sVar18 = strlen(pcVar4);
    sVar21 = (sh->text).l;
    sVar20 = (size_t)(int)sVar18;
    uVar13 = sVar21 + sVar20 + 1;
    if (uVar13 < (sh->text).m) {
      pcVar9 = (sh->text).s;
    }
    else {
      uVar13 = uVar13 >> 1 | uVar13;
      uVar13 = uVar13 >> 2 | uVar13;
      uVar13 = uVar13 >> 4 | uVar13;
      uVar13 = uVar13 >> 8 | uVar13;
      sVar19 = (uVar13 >> 0x10 | uVar13) + 1;
      (sh->text).m = sVar19;
      pcVar9 = (char *)realloc((sh->text).s,sVar19);
      if (pcVar9 == (char *)0x0) {
        return -1;
      }
      (sh->text).s = pcVar9;
      sVar21 = (sh->text).l;
    }
    memcpy(pcVar9 + sVar21,pcVar4,sVar20);
    sVar21 = sVar20 + (sh->text).l;
    (sh->text).l = sVar21;
    (sh->text).s[sVar21] = '\0';
    if ((int)sVar18 == -1) {
      return -1;
    }
    iVar7 = (int)(sh->text).l - (int)sVar16;
    pSVar12->len = iVar7;
    pcVar9 = string_ndup(sh->str_pool,(sh->text).s + (int)sVar16,(long)iVar7);
    pSVar12->str = pcVar9;
    pSVar12->next = (SAM_hdr_tag_s *)0x0;
    if (pcVar9 == (char *)0x0) {
      return -1;
    }
    if (pSVar15 == (SAM_hdr_tag *)0x0) {
      pSVar15 = local_f8;
    }
    pSVar15->next = pSVar12;
    pSVar15 = pSVar12;
  }
  return -1;
}

Assistant:

int sam_hdr_vadd(SAM_hdr *sh, const char *type, va_list ap, ...) {
    va_list args;
    SAM_hdr_type *h_type;
    SAM_hdr_tag *h_tag, *last;
    int new;
    khint32_t type_i = (type[0]<<8) | type[1], k;

#if defined(HAVE_VA_COPY)
    va_list ap_local;
#endif

    if (EOF == kputc_('@', &sh->text))
	return -1;
    if (EOF == kputsn(type, 2, &sh->text))
	return -1;

    if (!(h_type = pool_alloc(sh->type_pool)))
	return -1;
    if (-1 == (k = kh_put(sam_hdr, sh->h, type_i, &new)))
	return -1;
    kh_val(sh->h, k) = h_type;

    // Form the ring, either with self or other lines of this type
    if (!new) {
	SAM_hdr_type *t = kh_val(sh->h, k), *p;
	p = t->prev;
	    
	assert(p->next = t);
	p->next = h_type;
	h_type->prev = p;

	t->prev = h_type;
	h_type->next = t;
	h_type->order = p->order + 1;
    } else {
	h_type->prev = h_type->next = h_type;
	h_type->order = 0;
    }

    last = NULL;

    // Any ... varargs
    va_start(args, ap);
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(args, char *)))
	    break;
	v = va_arg(args, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(args);

#if defined(HAVE_VA_COPY)
    va_copy(ap_local, ap);
#   define ap ap_local
#endif

    // Plus the specified va_list params
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(ap);

    if (EOF == kputc('\n', &sh->text))
	return -1;

    int itype = (type[0]<<8) | type[1];
    if (-1 == sam_hdr_update_hashes(sh, itype, h_type))
	return -1;

    return h_type->order;
}